

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void __thiscall
AlignmentRecord::noOverlapMergeBAM
          (AlignmentRecord *this,string *dna,string *qualities,string *nucigar,int *c_pos,int *q_pos
          ,int *ref_pos,int i)

{
  char cVar1;
  vector<char,_std::allocator<char>_> *pvVar2;
  ShortDnaSequence *this_00;
  
  pvVar2 = &this->cigar1_unrolled;
  this_00 = &this->sequence1;
  if (i != 1) {
    this_00 = &this->sequence2;
    pvVar2 = &this->cigar2_unrolled;
  }
  cVar1 = (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start[*c_pos];
  switch(cVar1) {
  case 'D':
    q_pos = ref_pos;
    goto LAB_001722bc;
  case 'E':
  case 'F':
  case 'G':
  case 'J':
  case 'K':
  case 'L':
    goto switchD_00172269_caseD_45;
  case 'H':
    q_pos = ref_pos;
    break;
  case 'I':
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)dna);
    ShortDnaSequence::qualityChar(this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)qualities);
LAB_001722bc:
    std::__cxx11::string::push_back((char)nucigar);
    break;
  case 'M':
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)dna);
    ShortDnaSequence::qualityChar(this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)qualities);
    std::__cxx11::string::push_back((char)nucigar);
    *ref_pos = *ref_pos + 1;
    break;
  default:
    if (cVar1 != 'S') {
      return;
    }
    *ref_pos = *ref_pos + 1;
  }
  *q_pos = *q_pos + 1;
  *c_pos = *c_pos + 1;
switchD_00172269_caseD_45:
  return;
}

Assistant:

void AlignmentRecord::noOverlapMergeBAM(std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos, int& q_pos, int& ref_pos, int i) const{
    //cout<<"noOverlapMerge"<<endl;
    char c;
    const ShortDnaSequence* s = 0;
    if (i == 1){
        c = this->cigar1_unrolled[c_pos];
        s = &this->sequence1;
    } else {
        c = this->cigar2_unrolled[c_pos];
        s = &this->sequence2;
    }
    if (c == 'H'){
        ref_pos++;
        c_pos++;
    } else if (c == 'I') {
        dna += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        nucigar += 'I';
        q_pos++;
        c_pos++;
    } else if (c == 'D') {
        nucigar += 'D';
        ref_pos++;
        c_pos++;
    } else if (c == 'S'){
        ref_pos++;
        q_pos++;
        c_pos++;
    } else if (c == 'M'){
        dna += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        nucigar += c;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else {
        assert(false);

    }
}